

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

void remove_expired(CookieInfo *ci)

{
  time_t tVar1;
  Cookie *co_00;
  Curl_llist_node *pCVar2;
  Curl_llist_node *e;
  Curl_llist_node *n;
  uint i;
  curl_off_t now;
  Cookie *co;
  CookieInfo *ci_local;
  
  tVar1 = time((time_t *)0x0);
  if ((ci->next_expiration <= tVar1) || (ci->next_expiration == 0x7fffffffffffffff)) {
    ci->next_expiration = 0x7fffffffffffffff;
    for (n._4_4_ = 0; n._4_4_ < 0x3f; n._4_4_ = n._4_4_ + 1) {
      e = Curl_llist_head(ci->cookielist + n._4_4_);
      while (e != (Curl_llist_node *)0x0) {
        co_00 = (Cookie *)Curl_node_elem(e);
        pCVar2 = Curl_node_next(e);
        if ((co_00->expires == 0) || (tVar1 <= co_00->expires)) {
          e = pCVar2;
          if ((co_00->expires != 0) && (co_00->expires < ci->next_expiration)) {
            ci->next_expiration = co_00->expires;
          }
        }
        else {
          Curl_node_remove(e);
          freecookie(co_00);
          ci->numcookies = ci->numcookies + -1;
          e = pCVar2;
        }
      }
    }
  }
  return;
}

Assistant:

static void remove_expired(struct CookieInfo *ci)
{
  struct Cookie *co;
  curl_off_t now = (curl_off_t)time(NULL);
  unsigned int i;

  /*
   * If the earliest expiration timestamp in the jar is in the future we can
   * skip scanning the whole jar and instead exit early as there will not be
   * any cookies to evict. If we need to evict however, reset the
   * next_expiration counter in order to track the next one. In case the
   * recorded first expiration is the max offset, then perform the safe
   * fallback of checking all cookies.
   */
  if(now < ci->next_expiration &&
     ci->next_expiration != CURL_OFF_T_MAX)
    return;
  else
    ci->next_expiration = CURL_OFF_T_MAX;

  for(i = 0; i < COOKIE_HASH_SIZE; i++) {
    struct Curl_llist_node *n;
    struct Curl_llist_node *e = NULL;

    for(n = Curl_llist_head(&ci->cookielist[i]); n; n = e) {
      co = Curl_node_elem(n);
      e = Curl_node_next(n);
      if(co->expires && co->expires < now) {
        Curl_node_remove(n);
        freecookie(co);
        ci->numcookies--;
      }
      else {
        /*
         * If this cookie has an expiration timestamp earlier than what we
         * have seen so far then record it for the next round of expirations.
         */
        if(co->expires && co->expires < ci->next_expiration)
          ci->next_expiration = co->expires;
      }
    }
  }
}